

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O0

QEasingCurveFunction * curveToFunctionObject(Type type)

{
  undefined4 in_EDI;
  undefined8 in_stack_ffffffffffffffa8;
  Type type_00;
  ElasticEase *in_stack_ffffffffffffffb0;
  qreal in_stack_ffffffffffffffb8;
  qreal in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  Type type_01;
  BezierEase *in_stack_ffffffffffffffd0;
  QEasingCurveFunction *local_8;
  
  type_01 = (Type)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  type_00 = (Type)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  switch(in_EDI) {
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
    local_8 = (QEasingCurveFunction *)operator_new(0x58);
    ElasticEase::ElasticEase(in_stack_ffffffffffffffb0,type_00);
    break;
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
    local_8 = (QEasingCurveFunction *)operator_new(0x58);
    BackEase::BackEase((BackEase *)in_stack_ffffffffffffffb0,type_00);
    break;
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
    local_8 = (QEasingCurveFunction *)operator_new(0x58);
    BounceEase::BounceEase((BounceEase *)in_stack_ffffffffffffffb0,type_00);
    break;
  default:
    local_8 = (QEasingCurveFunction *)operator_new(0x58);
    QEasingCurveFunction::QEasingCurveFunction
              (&in_stack_ffffffffffffffd0->super_QEasingCurveFunction,type_01,
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(qreal)in_stack_ffffffffffffffb0)
    ;
    break;
  case 0x2d:
    local_8 = (QEasingCurveFunction *)operator_new(0x90);
    BezierEase::BezierEase(in_stack_ffffffffffffffd0,type_01);
    break;
  case 0x2e:
    local_8 = (QEasingCurveFunction *)operator_new(0x90);
    TCBEase::TCBEase((TCBEase *)local_8);
  }
  return local_8;
}

Assistant:

static QEasingCurveFunction *curveToFunctionObject(QEasingCurve::Type type)
{
    switch (type) {
    case QEasingCurve::InElastic:
    case QEasingCurve::OutElastic:
    case QEasingCurve::InOutElastic:
    case QEasingCurve::OutInElastic:
        return new ElasticEase(type);
    case QEasingCurve::OutBounce:
    case QEasingCurve::InBounce:
    case QEasingCurve::OutInBounce:
    case QEasingCurve::InOutBounce:
        return new BounceEase(type);
    case QEasingCurve::InBack:
    case QEasingCurve::OutBack:
    case QEasingCurve::InOutBack:
    case QEasingCurve::OutInBack:
        return new BackEase(type);
    case QEasingCurve::BezierSpline:
        return new BezierEase;
    case QEasingCurve::TCBSpline:
        return new TCBEase;
    default:
        return new QEasingCurveFunction(type, qreal(0.3), qreal(1.0), qreal(1.70158));
    }

    return nullptr;
}